

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O0

int xmlShellGrep(xmlShellCtxtPtr ctxt,char *arg,xmlNodePtr node,xmlNodePtr node2)

{
  FILE *pFVar1;
  xmlChar *pxVar2;
  xmlNodePtr node2_local;
  xmlNodePtr node_local;
  char *arg_local;
  xmlShellCtxtPtr ctxt_local;
  
  if (((ctxt != (xmlShellCtxtPtr)0x0) && (node != (xmlNodePtr)0x0)) && (arg != (char *)0x0)) {
    pxVar2 = xmlStrchr((xmlChar *)arg,'?');
    node2_local = node;
    if (((pxVar2 == (xmlChar *)0x0) &&
        (pxVar2 = xmlStrchr((xmlChar *)arg,'*'), pxVar2 == (xmlChar *)0x0)) &&
       (pxVar2 = xmlStrchr((xmlChar *)arg,'.'), pxVar2 == (xmlChar *)0x0)) {
      xmlStrchr((xmlChar *)arg,'[');
    }
LAB_001491b5:
    if (node2_local != (xmlNodePtr)0x0) {
      if (node2_local->type == XML_COMMENT_NODE) {
        pxVar2 = xmlStrstr(node2_local->content,(xmlChar *)arg);
        if (pxVar2 != (xmlChar *)0x0) {
          pFVar1 = (FILE *)ctxt->output;
          pxVar2 = xmlGetNodePath(node2_local);
          fprintf(pFVar1,"%s : ",pxVar2);
          xmlShellList(ctxt,(char *)0x0,node2_local,(xmlNodePtr)0x0);
        }
      }
      else if ((node2_local->type == XML_TEXT_NODE) &&
              (pxVar2 = xmlStrstr(node2_local->content,(xmlChar *)arg), pxVar2 != (xmlChar *)0x0)) {
        pFVar1 = (FILE *)ctxt->output;
        pxVar2 = xmlGetNodePath(node2_local->parent);
        fprintf(pFVar1,"%s : ",pxVar2);
        xmlShellList(ctxt,(char *)0x0,node2_local->parent,(xmlNodePtr)0x0);
      }
      if ((node2_local->type == XML_DOCUMENT_NODE) || (node2_local->type == XML_HTML_DOCUMENT_NODE))
      {
        node2_local = node2_local->children;
      }
      else if ((node2_local->children == (_xmlNode *)0x0) ||
              (node2_local->type == XML_ENTITY_REF_NODE)) {
        if (node2_local->next == (_xmlNode *)0x0) {
          do {
            if (node2_local == (xmlNodePtr)0x0) goto LAB_001491b5;
            if (node2_local->parent != (_xmlNode *)0x0) {
              node2_local = node2_local->parent;
            }
            if (node2_local->next != (_xmlNode *)0x0) {
              node2_local = node2_local->next;
              goto LAB_001491b5;
            }
          } while (node2_local->parent != (_xmlNode *)0x0);
          node2_local = (xmlNodePtr)0x0;
        }
        else {
          node2_local = node2_local->next;
        }
      }
      else {
        node2_local = node2_local->children;
      }
      goto LAB_001491b5;
    }
  }
  return 0;
}

Assistant:

static int
xmlShellGrep(xmlShellCtxtPtr ctxt ATTRIBUTE_UNUSED,
            char *arg, xmlNodePtr node, xmlNodePtr node2 ATTRIBUTE_UNUSED)
{
    if (!ctxt)
        return (0);
    if (node == NULL)
	return (0);
    if (arg == NULL)
	return (0);
#ifdef LIBXML_REGEXP_ENABLED
    if ((xmlStrchr((xmlChar *) arg, '?')) ||
	(xmlStrchr((xmlChar *) arg, '*')) ||
	(xmlStrchr((xmlChar *) arg, '.')) ||
	(xmlStrchr((xmlChar *) arg, '['))) {
    }
#endif
    while (node != NULL) {
        if (node->type == XML_COMMENT_NODE) {
	    if (xmlStrstr(node->content, (xmlChar *) arg)) {

		fprintf(ctxt->output, "%s : ", xmlGetNodePath(node));
                xmlShellList(ctxt, NULL, node, NULL);
	    }
        } else if (node->type == XML_TEXT_NODE) {
	    if (xmlStrstr(node->content, (xmlChar *) arg)) {

		fprintf(ctxt->output, "%s : ", xmlGetNodePath(node->parent));
                xmlShellList(ctxt, NULL, node->parent, NULL);
	    }
        }

        /*
         * Browse the full subtree, deep first
         */

        if ((node->type == XML_DOCUMENT_NODE) ||
            (node->type == XML_HTML_DOCUMENT_NODE)) {
            node = ((xmlDocPtr) node)->children;
        } else if ((node->children != NULL)
                   && (node->type != XML_ENTITY_REF_NODE)) {
            /* deep first */
            node = node->children;
        } else if (node->next != NULL) {
            /* then siblings */
            node = node->next;
        } else {
            /* go up to parents->next if needed */
            while (node != NULL) {
                if (node->parent != NULL) {
                    node = node->parent;
                }
                if (node->next != NULL) {
                    node = node->next;
                    break;
                }
                if (node->parent == NULL) {
                    node = NULL;
                    break;
                }
            }
	}
    }
    return (0);
}